

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O1

void PrintFunction(Proto *f,int full)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  Instruction *pIVar5;
  LocVar *pLVar6;
  Upvaldesc *pUVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  TString *pTVar11;
  char *pcVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  char *pcVar18;
  Proto *pPVar19;
  char *pcVar20;
  char *pcVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  
  pTVar11 = (TString *)"=?";
  if (f->source != (TString *)0x0) {
    pTVar11 = f->source + 1;
  }
  cVar1 = *(char *)&pTVar11->next;
  if (cVar1 == '\x1b') {
    pcVar12 = "(bstring)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar12 = (char *)((long)&pTVar11->next + 1);
  }
  else {
    pcVar12 = "(string)";
  }
  uVar3 = f->sizep;
  pcVar18 = "function";
  if (f->linedefined == 0) {
    pcVar18 = "main";
  }
  pcVar14 = "s";
  pcVar20 = "s";
  if (f->sizecode == 1) {
    pcVar20 = "";
  }
  printf("\n%s <%s:%d,%d> (%d instruction%s at %p)\n",pcVar18,pcVar12,(ulong)(uint)f->linedefined,
         (ulong)(uint)f->lastlinedefined,(ulong)(uint)f->sizecode,pcVar20,f);
  pcVar12 = "+";
  if (f->is_vararg == '\0') {
    pcVar12 = "";
  }
  pcVar18 = "s";
  if (f->numparams == 1) {
    pcVar18 = "";
  }
  pcVar20 = "s";
  if (f->maxstacksize == 1) {
    pcVar20 = "";
  }
  pcVar21 = "s";
  if (f->sizeupvalues == 1) {
    pcVar21 = "";
  }
  printf("%d%s param%s, %d slot%s, %d upvalue%s, ",(ulong)f->numparams,pcVar12,pcVar18,
         (ulong)f->maxstacksize,pcVar20,(ulong)(uint)f->sizeupvalues,pcVar21);
  pcVar12 = "s";
  if (f->sizelocvars == 1) {
    pcVar12 = "";
  }
  pcVar18 = "s";
  if (f->sizek == 1) {
    pcVar18 = "";
  }
  if (f->sizep == 1) {
    pcVar14 = "";
  }
  printf("%d local%s, %d constant%s, %d function%s\n",(ulong)(uint)f->sizelocvars,pcVar12,
         (ulong)(uint)f->sizek,pcVar18,(ulong)(uint)f->sizep,pcVar14,pcVar21);
  iVar4 = f->sizecode;
  if (0 < iVar4) {
    pIVar5 = f->code;
    uVar13 = 0;
    do {
      if (f->lineinfo == (int *)0x0) {
        uVar10 = 0xffffffff;
      }
      else {
        uVar10 = f->lineinfo[(int)uVar13];
      }
      uVar16 = pIVar5[(int)uVar13];
      uVar15 = uVar13 + 1;
      printf("\t%d\t",(ulong)uVar15);
      if ((int)uVar10 < 1) {
        printf("[-]\t");
      }
      else {
        printf("[%d]\t",(ulong)uVar10);
      }
      uVar22 = uVar16 & 0x3f;
      uVar24 = uVar16 >> 6;
      uVar25 = (ulong)uVar24 & 0xff;
      uVar9 = uVar16 >> 0x17;
      uVar10 = uVar16 >> 0xe;
      printf("%-9s\t",luaP_opnames[uVar22]);
      bVar2 = luaP_opmodes[uVar22];
      switch(bVar2 & 3) {
      case 0:
        printf("%d",uVar25);
        if ((bVar2 & 0x30) != 0) {
          uVar17 = ~uVar9 | 0xffffff00;
          if (-1 < (int)uVar16) {
            uVar17 = uVar9;
          }
          printf(" %d",(ulong)uVar17);
        }
        if ((bVar2 & 0xc) != 0) {
          uVar17 = ~uVar10 | 0xffffff00;
          if ((uVar16 >> 0x16 & 1) == 0) {
            uVar17 = uVar10 & 0x1ff;
          }
LAB_00104d19:
          pcVar12 = " %d";
          goto LAB_00104d20;
        }
        break;
      case 1:
        printf("%d",uVar25);
        if ((bVar2 & 0x30) == 0x10) {
          printf(" %d",(ulong)uVar10);
        }
        else if ((bVar2 & 0x30) == 0x30) {
          uVar17 = ~uVar10;
          goto LAB_00104d19;
        }
        break;
      case 2:
        printf("%d %d",uVar25,(ulong)(uVar10 - 0x1ffff));
        break;
      case 3:
        uVar17 = ~uVar24;
        pcVar12 = "%d";
LAB_00104d20:
        printf(pcVar12,(ulong)uVar17);
      }
      switch(uVar22) {
      case 1:
        printf("\t; ");
        goto LAB_00104eca;
      default:
        break;
      case 5:
      case 9:
        lVar23 = *(long *)((long)&f->upvalues->name + (ulong)(uVar9 << 4));
        pPVar19 = (Proto *)0x118139;
        if (lVar23 != 0) {
          pPVar19 = (Proto *)(lVar23 + 0x18);
        }
        pcVar12 = "\t; %s";
        goto LAB_00104e6a;
      case 6:
        lVar23 = *(long *)((long)&f->upvalues->name + (ulong)(uVar9 << 4));
        pcVar12 = "-";
        if (lVar23 != 0) {
          pcVar12 = (char *)(lVar23 + 0x18);
        }
        printf("\t; %s",pcVar12);
        if ((uVar16 >> 0x16 & 1) != 0) {
          putchar(0x20);
          PrintConstant(f,uVar10 & 0xff);
        }
        break;
      case 7:
      case 0xc:
        if ((uVar16 >> 0x16 & 1) != 0) {
          printf("\t; ");
          uVar10 = uVar10 & 0xff;
          goto LAB_00104eca;
        }
        break;
      case 8:
        lVar23 = *(long *)((long)&f->upvalues->name + (ulong)(uint)((int)uVar25 << 4));
        pcVar12 = "-";
        if (lVar23 != 0) {
          pcVar12 = (char *)(lVar23 + 0x18);
        }
        printf("\t; %s",pcVar12);
        if ((int)uVar16 < 0) {
          putchar(0x20);
          PrintConstant(f,uVar9 & 0xff);
        }
        if ((uVar16 >> 0x16 & 1) != 0) {
          putchar(0x20);
LAB_00104f41:
          PrintConstant(f,uVar10 & 0xff);
        }
        break;
      case 10:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x1f:
      case 0x20:
      case 0x21:
        if ((uVar16 & 0x80400000) != 0) {
          printf("\t; ");
          if ((int)uVar16 < 0) {
            PrintConstant(f,uVar9 & 0xff);
          }
          else {
            putchar(0x2d);
          }
          putchar(0x20);
          if ((uVar16 >> 0x16 & 1) != 0) goto LAB_00104f41;
          putchar(0x2d);
        }
        break;
      case 0x1e:
      case 0x27:
      case 0x28:
      case 0x2a:
        printf("\t; to %d",(ulong)(uVar13 + (uVar10 - 0x1ffff) + 2));
        break;
      case 0x2b:
        if ((uVar10 & 0x1ff) == 0) {
          printf("\t; %d",(ulong)pIVar5[(int)uVar15]);
          uVar13 = uVar15;
        }
        else {
          printf("\t; %d");
        }
        break;
      case 0x2c:
        pPVar19 = f->p[uVar10];
        pcVar12 = "\t; %p";
LAB_00104e6a:
        printf(pcVar12,pPVar19);
        break;
      case 0x2e:
        printf("\t; ");
        uVar10 = uVar24;
LAB_00104eca:
        PrintConstant(f,uVar10);
      }
      putchar(10);
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < iVar4);
  }
  if (full != 0) {
    uVar13 = f->sizek;
    printf("constants (%d) for %p:\n",(ulong)uVar13,f);
    if (0 < (int)uVar13) {
      uVar10 = 0;
      do {
        uVar16 = uVar10 + 1;
        printf("\t%d\t",(ulong)uVar16);
        PrintConstant(f,uVar10);
        putchar(10);
        uVar10 = uVar16;
      } while (uVar13 != uVar16);
    }
    uVar13 = f->sizelocvars;
    printf("locals (%d) for %p:\n",(ulong)uVar13,f);
    if (0 < (long)(int)uVar13) {
      lVar23 = 0xc;
      uVar25 = 0;
      do {
        pLVar6 = f->locvars;
        printf("\t%d\t%s\t%d\t%d\n",uVar25 & 0xffffffff,
               *(long *)((long)pLVar6 + lVar23 + -0xc) + 0x18,
               (ulong)(*(int *)((long)pLVar6 + lVar23 + -4) + 1),
               (ulong)(*(int *)((long)&pLVar6->varname + lVar23) + 1));
        uVar25 = uVar25 + 1;
        lVar23 = lVar23 + 0x10;
      } while ((long)(int)uVar13 != uVar25);
    }
    uVar13 = f->sizeupvalues;
    printf("upvalues (%d) for %p:\n",(ulong)uVar13,f);
    if (0 < (long)(int)uVar13) {
      lVar23 = 9;
      uVar25 = 0;
      do {
        pUVar7 = f->upvalues;
        lVar8 = *(long *)((long)pUVar7 + lVar23 + -9);
        pcVar12 = (char *)(lVar8 + 0x18);
        if (lVar8 == 0) {
          pcVar12 = "-";
        }
        printf("\t%d\t%s\t%d\t%d\n",uVar25 & 0xffffffff,pcVar12,
               (ulong)*(byte *)((long)pUVar7 + lVar23 + -1),
               (ulong)*(byte *)((long)&pUVar7->name + lVar23));
        uVar25 = uVar25 + 1;
        lVar23 = lVar23 + 0x10;
      } while ((long)(int)uVar13 != uVar25);
    }
  }
  if (0 < (int)uVar3) {
    uVar25 = 0;
    do {
      PrintFunction(f->p[uVar25],full);
      uVar25 = uVar25 + 1;
    } while (uVar3 != uVar25);
  }
  return;
}

Assistant:

static void PrintFunction(const Proto *f, int full) {
    int i, n = f->sizep;
    PrintHeader(f);
    PrintCode(f);
    if (full) PrintDebug(f);
    for (i = 0; i < n; i++) PrintFunction(f->p[i], full);
}